

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O2

void __thiscall
gvr::ColoredPointCloud::resizeVertexList
          (ColoredPointCloud *this,int vn,bool with_scanprop,bool with_scanpos)

{
  uchar *puVar1;
  int iVar2;
  uchar *puVar3;
  long lVar4;
  ulong uVar5;
  
  iVar2 = -1;
  if (-1 < vn) {
    iVar2 = vn * 3;
  }
  puVar3 = (uchar *)operator_new__((long)iVar2);
  iVar2 = (this->super_PointCloud).n;
  if (vn <= iVar2) {
    iVar2 = vn;
  }
  puVar1 = this->rgb;
  for (uVar5 = (ulong)(uint)(iVar2 * 3); 0 < (int)uVar5; uVar5 = uVar5 - 1) {
    puVar3[uVar5 - 1] = puVar1[uVar5 - 1];
  }
  for (lVar4 = (long)(iVar2 * 3); lVar4 < vn * 3; lVar4 = lVar4 + 1) {
    puVar3[lVar4] = '\0';
  }
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  this->rgb = puVar3;
  PointCloud::resizeVertexList(&this->super_PointCloud,vn,with_scanprop,with_scanpos);
  return;
}

Assistant:

void ColoredPointCloud::resizeVertexList(int vn, bool with_scanprop, bool with_scanpos)
{
  unsigned char *p=new unsigned char [3*vn];

  for (int i=3*std::min(getVertexCount(), vn)-1; i>=0; i--)
  {
    p[i]=rgb[i];
  }

  for (int i=3*std::min(getVertexCount(), vn); i<3*vn; i++)
  {
    p[i]=0;
  }

  delete [] rgb;

  rgb=p;

  PointCloud::resizeVertexList(vn, with_scanprop, with_scanpos);
}